

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O3

uint __thiscall
ON_SubDMeshFragment::GetFaceFragments
          (ON_SubDMeshFragment *this,ON_SubDMeshFragment **fragments,size_t fragments_capacity)

{
  ushort uVar1;
  ulong uVar2;
  ON_SubDMeshFragment *pOVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  
  uVar1 = this->m_face_fragment_count;
  uVar4 = 0;
  if ((uint)uVar1 + (uint)(uVar1 == 0) <= fragments_capacity) {
    pOVar3 = FirstFaceFragment(this);
    uVar6 = (uint)uVar1;
    uVar4 = 0;
    if (pOVar3 != (ON_SubDMeshFragment *)0x0 && uVar6 != 0) {
      uVar2 = 1;
      do {
        uVar5 = uVar2;
        fragments[uVar5 - 1] = pOVar3;
        if (uVar6 <= uVar5) break;
        pOVar3 = pOVar3->m_next_fragment;
        uVar2 = uVar5 + 1;
      } while (pOVar3 != (ON_SubDMeshFragment *)0x0);
      uVar4 = 0;
      if (uVar6 <= uVar5) {
        uVar4 = uVar6;
      }
    }
  }
  return uVar4;
}

Assistant:

unsigned int ON_SubDMeshFragment::FaceFragmentCount() const
{
  return m_face_fragment_count;
}